

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicselement.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsElement::ComputeRequiredDataT<double>
          (TPZMultiphysicsElement *this,TPZVec<double> *intpointtemp,
          TPZVec<TPZTransform<double>_> *trvec,TPZVec<TPZMaterialDataT<double>_> *datavec)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZGeoEl *pTVar2;
  TPZMaterialDataT<double> *pTVar3;
  TPZVec<TPZMaterialDataT<double>_> *in_RCX;
  TPZVec<TPZTransform<double>_> *in_RDX;
  TPZVec<double> *in_RDI;
  TPZManVector<double,_3> intpoint;
  TPZInterpolationSpace *msp;
  int64_t iref;
  int64_t ElemVecSize;
  TPZManVector<double,_3> *this_00;
  TPZTransform<double> *in_stack_ffffffffffffff58;
  TPZManVector<double,_3> *local_a0;
  TPZVec<double> *in_stack_ffffffffffffff78;
  TPZTransform<double> *in_stack_ffffffffffffff80;
  undefined1 local_70 [56];
  TPZManVector<double,_3> *local_38;
  long local_30;
  long local_28;
  TPZVec<TPZMaterialDataT<double>_> *local_20;
  TPZVec<TPZTransform<double>_> *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  iVar1 = (*in_RDI->_vptr_TPZVec[0x4e])();
  local_28 = CONCAT44(extraout_var,iVar1);
  for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
    iVar1 = (*in_RDI->_vptr_TPZVec[0x4b])(in_RDI,local_30);
    if (CONCAT44(extraout_var_00,iVar1) == 0) {
      local_a0 = (TPZManVector<double,_3> *)0x0;
    }
    else {
      local_a0 = (TPZManVector<double,_3> *)
                 __dynamic_cast(CONCAT44(extraout_var_00,iVar1),&TPZCompEl::typeinfo,
                                &TPZInterpolationSpace::typeinfo,0);
    }
    local_38 = local_a0;
    if (local_a0 != (TPZManVector<double,_3> *)0x0) {
      pTVar2 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffff58);
      (**(code **)(*(long *)pTVar2 + 0x210))();
      TPZManVector<double,_3>::TPZManVector
                ((TPZManVector<double,_3> *)in_stack_ffffffffffffff80,
                 (int64_t)in_stack_ffffffffffffff78,(double *)in_RDI);
      in_stack_ffffffffffffff58 = TPZVec<TPZTransform<double>_>::operator[](local_18,local_30);
      TPZTransform<double>::Apply(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RDI);
      this_00 = local_38;
      pTVar3 = TPZVec<TPZMaterialDataT<double>_>::operator[](local_20,local_30);
      (*(this_00->super_TPZVec<double>)._vptr_TPZVec[0x55])(this_00,pTVar3,local_70);
      TPZManVector<double,_3>::~TPZManVector(this_00);
    }
  }
  return;
}

Assistant:

void TPZMultiphysicsElement::ComputeRequiredDataT(TPZVec<REAL> &intpointtemp, TPZVec<TPZTransform<> > &trvec, TPZVec<TPZMaterialDataT<TVar>> &datavec)
{
    int64_t ElemVecSize = NMeshes();
    for (int64_t iref = 0; iref < ElemVecSize; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(Element(iref));
        if (!msp) {
            continue;
        }
        
        TPZManVector<REAL,3> intpoint(msp->Reference()->Dimension(),0.);
        
        trvec[iref].Apply(intpointtemp, intpoint);
        
        msp->ComputeRequiredData(datavec[iref], intpoint);
    }
}